

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_kinematics.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  time_t tVar2;
  Scalar *pSVar3;
  ostream *poVar4;
  ulong uVar5;
  size_type sVar6;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this;
  non_const_type local_3f8 [3];
  int local_3dc;
  undefined1 local_3d8 [4];
  int i_1;
  undefined1 local_350 [8];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  theta_q;
  Matrix4d local_2b8;
  Matrix4d local_238;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0> local_1b0;
  Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>
  local_1a0;
  Matrix<double,4,4,0,4,4> local_188 [8];
  Matrix4d T14;
  undefined1 local_d8 [8];
  Matrix4d T;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  Vector6d theta;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)local_48);
  for (local_4c = 0; local_4c < 6; local_4c = local_4c + 1) {
    iVar1 = rand();
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_48,
                        (long)local_4c);
    *pSVar3 = ((double)(iVar1 % 100) / 100.0) * 3.141592653589793;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"theta: ");
  T.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)local_48);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                     *)(T.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array + 0xf));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix
            ((Matrix<double,_6,_1,_0,_6,_1> *)
             (T14.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
              array + 0xf),(Matrix<double,_6,_1,_0,_6,_1> *)local_48);
  forward_kinematics((Matrix4d *)local_d8,
                     (Vector6d *)
                     (T14.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                      m_data.array + 0xf));
  poVar4 = std::operator<<((ostream *)&std::cout,"T:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_d8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_48,1);
  transform(&local_238,1,*pSVar3);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_48,2);
  transform(&local_2b8,2,*pSVar3);
  local_1b0 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_238,
                         (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_2b8);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)local_48,3);
  transform((Matrix4d *)
            &theta_q.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,3,*pSVar3);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>::
  operator*(&local_1a0,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>>
             *)&local_1b0,
            (MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
            &theta_q.
             super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Matrix<double,4,4,0,4,4>,0>,Eigen::Matrix<double,4,4,0,4,4>,0>>
            (local_188,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_0>_>
              *)&local_1a0);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix
            ((Matrix<double,_4,_4,_0,_4,_4> *)local_3d8,(Matrix<double,_4,_4,_0,_4,_4> *)local_d8);
  inverse_kinematics((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                      *)local_350,(Matrix4d *)local_3d8);
  local_3dc = 0;
  while( true ) {
    uVar5 = (ulong)local_3dc;
    sVar6 = std::
            vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
            ::size((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                    *)local_350);
    if (sVar6 <= uVar5) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"theta_e: ");
    this = (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           std::
           vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                         *)local_350,(long)local_3dc);
    local_3f8[0] = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose(this);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                       *)local_3f8);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_3dc = local_3dc + 1;
  }
  std::
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_std::allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
             *)local_350);
  return 0;
}

Assistant:

int main()
{

	srand(time(0));
	Vector6d theta;
	// theta <<  2.04204,  1.19381,  1.31947,  1.25664, 0.251327, 0.345575;
	for (int i = 0; i < 6; i++)
	{
		// theta(i) = 0;//i * M_PI / 2;
		theta(i) = rand() % 100 / 100.0 * M_PI;
	}

	cout << "theta: " << theta.transpose() << endl;

	Matrix4d T = forward_kinematics(theta);
	cout << "T:\n" << T << endl;
	Matrix4d T14 = transform(1, theta(1)) * transform(2, theta(2)) * transform(3, theta(3));
	vector<Vector6d> theta_q = inverse_kinematics(T);
	for(int i = 0; i < theta_q.size(); i++)
	{
		cout << "theta_e: " << theta_q[i].transpose() << endl;
	}
	return 0;
}